

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O0

void __thiscall trng::yarn3::step(yarn3 *this)

{
  int32_t iVar1;
  long in_RDI;
  uint64_t t;
  
  *(undefined4 *)(in_RDI + 0x14) = *(undefined4 *)(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RDI + 0xc);
  iVar1 = int_math::modulo<2147483647,3>(0x1152f6);
  *(int32_t *)(in_RDI + 0xc) = iVar1;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2])};
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 3>(t);
  }